

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O1

void __thiscall BOCC_CTA::BOCC_CTA(BOCC_CTA *this,int m)

{
  DataItem *this_00;
  int iVar1;
  undefined1 local_68 [56];
  
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transactions)._M_h._M_buckets = &(this->transactions)._M_h._M_single_bucket;
  (this->transactions)._M_h._M_bucket_count = 1;
  (this->transactions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->transactions)._M_h._M_element_count = 0;
  (this->transactions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->transactions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->transactions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scheduler_lock)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x20) = 0;
  (this->scheduler_lock)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x30) = 0;
  this->M = m;
  this->counter = 0;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._0_8_ = (DataItem *)0x0;
  local_68._8_8_ = 0;
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::_M_move_assign(&this->dataItems,local_68);
  if ((DataItem *)local_68._0_8_ != (DataItem *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  if (0 < this->M) {
    iVar1 = 0;
    do {
      this_00 = (DataItem *)operator_new(0x60);
      DataItem::DataItem(this_00,-2);
      local_68._0_8_ = this_00;
      std::vector<DataItem*,std::allocator<DataItem*>>::emplace_back<DataItem*>
                ((vector<DataItem*,std::allocator<DataItem*>> *)&this->dataItems,
                 (DataItem **)local_68);
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->M);
  }
  local_68._0_8_ = local_68 + 0x30;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_68._8_8_ = 1;
  local_68._32_8_ = 0x3f800000;
  local_68._40_8_ = 0;
  local_68._48_8_ = (__node_base_ptr)0x0;
  std::
  _Hashtable<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->transactions)._M_h,local_68);
  std::
  _Hashtable<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

BOCC_CTA::BOCC_CTA(int m): M(m){
    counter = 0;

    dataItems = std::vector<DataItem*>();
    for(int i=0; i<M; i++) dataItems.push_back(new DataItem(DataItem::INIT));

    transactions = std::unordered_map<int, Transaction*>();

}